

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QByteArray * __thiscall
QMetaEnum::valueToKeys(QByteArray *__return_storage_ptr__,QMetaEnum *this,quint64 value)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  uint uVar3;
  QMetaObject *pQVar4;
  uint *puVar5;
  uint *puVar6;
  QMetaTypeInterface *pQVar7;
  Data *pDVar8;
  void *pvVar9;
  bool bVar10;
  quint64 qVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  EnumExtendMode mode;
  int iVar16;
  int iVar17;
  long in_FS_OFFSET;
  QVarLengthArray<QByteArrayView,_32LL> parts;
  QByteArrayView local_260;
  QVLABase<QByteArrayView> local_250;
  undefined1 local_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar4 = this->mobj;
  if (pQVar4 == (QMetaObject *)0x0) goto LAB_00287a2d;
  puVar5 = (this->data).d;
  uVar2 = puVar5[2];
  iVar16 = 0x40;
  if (((uVar2 & 0x40) == 0) && (iVar16 = 0, (uVar2 & 1) == 0)) {
    puVar6 = (pQVar4->d).data;
    pQVar7 = (pQVar4->d).metaTypes
             [(long)(int)puVar6[6] +
              (ulong)((int)((ulong)((long)puVar5 - (long)puVar6) >> 2) - puVar6[9]) / 5];
    if (pQVar7 == (QMetaTypeInterface *)0x0) {
      iVar16 = -1;
    }
    else {
      iVar16 = ((pQVar7->flags >> 8 & 1) != 0) - 1;
    }
  }
  qVar11 = value;
  if (iVar16 == 0) {
LAB_00287837:
    if (qVar11 >> 0x20 != 0) goto LAB_00287a2d;
  }
  else if (iVar16 != 0x40) {
    qVar11 = value + 0x80000000;
    goto LAB_00287837;
  }
  memset(&local_250,0xaa,0x218);
  local_250.super_QVLABaseBase.a = 0x20;
  local_250.super_QVLABaseBase.s = 0;
  local_250.super_QVLABaseBase.ptr = local_238;
  uVar3 = (this->data).d[3];
  if (0 < (int)uVar3) {
    iVar17 = uVar3 + 1;
    iVar14 = uVar3 * 2 + -1;
    qVar11 = value;
    do {
      puVar5 = (this->data).d;
      uVar3 = puVar5[4];
      puVar6 = (this->mobj->d).data;
      uVar2 = puVar6[uVar3 + iVar14];
      if (iVar16 < 1) {
        uVar13 = (long)(int)uVar2;
        if (iVar16 == 0) {
          uVar13 = (ulong)uVar2;
        }
      }
      else {
        uVar13 = CONCAT44(puVar6[(uVar3 + puVar5[3] * 2 + iVar17) - 2],uVar2);
      }
      if ((uVar13 == value) || (uVar13 != 0 && (uVar13 & ~qVar11) == 0)) {
        puVar5 = (this->mobj->d).stringdata;
        local_260.m_size = (qsizetype)puVar5[(int)(puVar6[(uVar3 + iVar14) - 1] * 2 + 1)];
        local_260.m_data =
             (storage_type *)
             ((ulong)puVar5[(long)(int)puVar6[(uVar3 + iVar14) - 1] * 2] + (long)puVar5);
        QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                  (&local_250,0x20,local_238,&local_260);
        qVar11 = qVar11 & ~uVar13;
      }
      iVar17 = iVar17 + -1;
      iVar14 = iVar14 + -2;
    } while (1 < iVar17);
  }
  if (local_250.super_QVLABaseBase.s != 0) {
    lVar15 = local_250.super_QVLABaseBase.s + -1;
    lVar12 = 0;
    do {
      lVar15 = lVar15 + *(long *)((long)local_250.super_QVLABaseBase.ptr + lVar12);
      lVar12 = lVar12 + 0x10;
    } while (local_250.super_QVLABaseBase.s << 4 != lVar12);
    pDVar8 = (__return_storage_ptr__->d).d;
    if (((pDVar8 == (Data *)0x0) ||
        (1 < (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar8[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar8->super_QArrayData).alloc) - (long)(__return_storage_ptr__->d).ptr) < lVar15))
    {
      lVar12 = (__return_storage_ptr__->d).size;
      if (lVar15 < lVar12) {
        lVar15 = lVar12;
      }
      QByteArray::reallocData(__return_storage_ptr__,lVar15,KeepSize);
    }
    pvVar9 = local_250.super_QVLABaseBase.ptr;
    pDVar8 = (__return_storage_ptr__->d).d;
    if ((pDVar8 != (Data *)0x0) && ((pDVar8->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar8->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if (local_250.super_QVLABaseBase.s != 0) {
      lVar15 = local_250.super_QVLABaseBase.s << 4;
      bVar10 = true;
      do {
        if (!bVar10) {
          QByteArray::append(__return_storage_ptr__,'|');
        }
        QByteArray::append(__return_storage_ptr__,*(char **)((long)pvVar9 + lVar15 + -8),
                           *(qsizetype *)((long)pvVar9 + lVar15 + -0x10));
        bVar10 = false;
        lVar15 = lVar15 + -0x10;
      } while (lVar15 != 0);
    }
  }
  if ((undefined1 *)local_250.super_QVLABaseBase.ptr != local_238) {
    QtPrivate::sizedFree(local_250.super_QVLABaseBase.ptr,local_250.super_QVLABaseBase.a << 4);
  }
LAB_00287a2d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QMetaEnum::valueToKeys(quint64 value) const
{
    QByteArray keys;
    if (!mobj)
        return keys;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return keys;

    QVarLengthArray<QByteArrayView, sizeof(int) * CHAR_BIT> parts;
    quint64 v = value;

    // reverse iterate to ensure values like Qt::Dialog=0x2|Qt::Window are processed first.
    for (int i = data.keyCount() - 1; i >= 0; --i) {
        quint64 k = value_helper(i, mode);
        if ((k != 0 && (v & k) == k) || (k == value)) {
            v = v & ~k;
            parts.push_back(stringDataView(mobj, mobj->d.data[data.data() + 2 * i]));
        }
    }
    join_reversed(keys, parts, '|');
    return keys;
}